

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O2

void __thiscall PGSStreamReader::intDecodeStream(PGSStreamReader *this,uint8_t *buffer,size_t len)

{
  uint16_t uVar1;
  uint8_t uVar2;
  long lVar3;
  uint8_t *end;
  BitStreamReader bitReader;
  BitStreamReader local_48;
  
  end = buffer + len;
  do {
    lVar3 = (long)end - (long)buffer;
    if (end < buffer || lVar3 == 0) {
      return;
    }
    if (lVar3 < 10) {
      return;
    }
    uVar2 = *buffer;
    if (uVar2 == '\0') {
      if (((buffer[1] == '\0') && (buffer[2] == '\x01')) &&
         (buffer = buffer + (byte)(buffer[8] + 9), end <= buffer)) {
        return;
      }
LAB_001d1809:
      uVar2 = *buffer;
      lVar3 = (long)end - (long)buffer;
    }
    else if (uVar2 == 'P') {
      if (buffer[1] == 'G') {
        buffer = buffer + 10;
      }
      goto LAB_001d1809;
    }
    uVar1 = AV_RB16(buffer + 1);
    if (lVar3 < (long)((ulong)uVar1 + 3)) {
      return;
    }
    if (uVar2 == '\x16') {
      local_48.super_BitStream.m_totalBits = 0;
      local_48.super_BitStream.m_buffer = (uint *)0x0;
      local_48.super_BitStream.m_initBuffer = (uint *)0x0;
      local_48.m_curVal = 0;
      local_48.m_bitLeft = 0;
      BitStreamReader::setBuffer(&local_48,buffer + 3,end);
      video_descriptor(this,&local_48);
      return;
    }
    buffer = buffer + 3 + uVar1;
  } while( true );
}

Assistant:

void PGSStreamReader::intDecodeStream(uint8_t* buffer, const size_t len)
{
    const uint8_t* bufEnd = buffer + len;
    uint8_t* curPos = buffer;
    while (curPos < bufEnd)
    {
        if (bufEnd - curPos < 10)
            return;
        if (curPos[0] == 'P' && curPos[1] == 'G')
            curPos += 10;
        else if (curPos[0] == 0 && curPos[1] == 0 && curPos[2] == 1)
        {
            const auto pesPacket = reinterpret_cast<PESPacket*>(curPos);
            curPos += pesPacket->getHeaderLength();
            if (curPos >= bufEnd)
                return;
        }

        const uint8_t segment_type = *curPos;
        const auto segment_len = AV_RB16(curPos + 1);
        if (bufEnd - curPos < 3ll + segment_len)
            return;

        curPos += 3;
        if (segment_type == 0x16)
        {
            BitStreamReader bitReader{};
            bitReader.setBuffer(curPos, bufEnd);
            video_descriptor(bitReader);
            return;
        }
        curPos += segment_len;
    }
}